

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharpyuv.c
# Opt level: O2

int SharpYuvConvertWithOptions
              (void *r_ptr,void *g_ptr,void *b_ptr,int rgb_step,int rgb_stride,int rgb_bit_depth,
              void *y_ptr,int y_stride,void *u_ptr,int u_stride,void *v_ptr,int v_stride,
              int yuv_bit_depth,int width,int height,SharpYuvOptions *options)

{
  int16_t *piVar1;
  uint uVar2;
  short sVar3;
  SharpYuvTransferFunctionType transfer_type;
  SharpYuvConversionMatrix *pSVar4;
  byte bVar5;
  byte bVar6;
  fixed_y_t fVar7;
  int iVar8;
  int iVar9;
  fixed_y_t *src;
  fixed_y_t *__ptr;
  fixed_y_t *__ptr_00;
  fixed_y_t *dst;
  int16_t *__ptr_01;
  int16_t *__ptr_02;
  fixed_t *dst_00;
  ulong uVar10;
  ulong uVar11;
  uint64_t uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint64_t total_size;
  fixed_y_t *pfVar19;
  int16_t *piVar20;
  int16_t *piVar21;
  fixed_y_t *pfVar22;
  int iVar23;
  ushort uVar24;
  int iVar25;
  ushort uVar26;
  undefined2 uVar27;
  uint uVar28;
  int iVar29;
  ulong uVar31;
  uint16_t *puVar32;
  long lVar33;
  uint uVar34;
  uint64_t total_size_1;
  size_t sVar35;
  int iVar36;
  uint uv_w_00;
  int A;
  fixed_y_t *dst_01;
  long lVar37;
  ulong uVar38;
  ulong uVar39;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int yuv_max;
  fixed_y_t *src1;
  int uv_w;
  size_t local_200;
  fixed_t *best_uv_base;
  int16_t *local_1e0;
  int uv_h;
  fixed_y_t *src2;
  void *local_160;
  void *local_158;
  void *local_150;
  ulong local_108;
  int16_t *local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  ulong local_a0;
  long local_98;
  long local_90;
  long local_88;
  fixed_y_t *local_80;
  int16_t *local_78;
  fixed_y_t *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  ulong uVar30;
  
  iVar36 = 1 << ((byte)rgb_bit_depth - 1 & 0x1f);
  iVar9 = 2;
  if (0xc < rgb_bit_depth) {
    iVar9 = 0xe - rgb_bit_depth;
  }
  local_160 = y_ptr;
  local_150 = u_ptr;
  local_158 = v_ptr;
  auVar41._0_4_ = -(uint)(r_ptr == (void *)0x0);
  auVar41._4_4_ = -(uint)(g_ptr == (void *)0x0);
  auVar41._8_4_ = -(uint)(b_ptr == (void *)0x0);
  auVar41._12_4_ = -(uint)(y_ptr == (void *)0x0);
  iVar23 = movmskps((int)r_ptr,auVar41);
  iVar25 = 0;
  iVar29 = 0;
  if (((((((v_ptr != (void *)0x0 && 0x80000001 < width + 0x80000001U) && u_ptr != (void *)0x0) &&
         0x80000001 < height + 0x80000001U) && iVar23 == 0) && ((uint)rgb_bit_depth < 0x11)) &&
      (iVar29 = iVar25, (0x11500U >> (rgb_bit_depth & 0x1fU) & 1) != 0)) &&
     (((uint)yuv_bit_depth < 0xd && ((0x1500U >> (yuv_bit_depth & 0x1fU) & 1) != 0)))) {
    pSVar4 = options->yuv_matrix;
    transfer_type = options->transfer_type;
    if ((((uint)rgb_bit_depth < 9) || (((rgb_stride | rgb_step) & 1U) == 0)) &&
       (((uint)yuv_bit_depth < 9 || (((u_stride | y_stride | v_stride) & 1U) == 0)))) {
      uVar2 = ~(-1 << ((byte)yuv_bit_depth & 0x1f));
      SharpYuvInit((VP8CPUInfo)&SharpYuvGetCPUInfo);
      if (rgb_bit_depth == yuv_bit_depth) {
        local_d8 = *(undefined8 *)pSVar4->rgb_to_y;
        uStack_d0 = *(undefined8 *)(pSVar4->rgb_to_y + 2);
        local_c8 = *(undefined8 *)pSVar4->rgb_to_u;
        uStack_c0 = *(undefined8 *)(pSVar4->rgb_to_u + 2);
        local_b8 = *(undefined8 *)pSVar4->rgb_to_v;
        uStack_b0 = *(undefined8 *)(pSVar4->rgb_to_v + 2);
      }
      else {
        uVar28 = ~(-1 << ((byte)rgb_bit_depth & 0x1f));
        for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
          *(int *)((long)&local_d8 + lVar15 * 4) =
               (int)(pSVar4->rgb_to_y[lVar15] * uVar2 + iVar36) / (int)uVar28;
          *(int *)((long)&local_c8 + lVar15 * 4) =
               (int)(pSVar4->rgb_to_u[lVar15] * uVar2 + iVar36) / (int)uVar28;
          *(int *)((long)&local_b8 + lVar15 * 4) =
               (int)(pSVar4->rgb_to_v[lVar15] * uVar2 + iVar36) / (int)uVar28;
        }
      }
      bVar5 = (byte)iVar9;
      bVar6 = -bVar5;
      iVar25 = pSVar4->rgb_to_v[3] >> (bVar6 & 0x1f);
      iVar36 = pSVar4->rgb_to_y[3] >> (bVar6 & 0x1f);
      iVar23 = pSVar4->rgb_to_u[3] >> (bVar6 & 0x1f);
      if (-1 < iVar9) {
        iVar25 = pSVar4->rgb_to_v[3] << (bVar5 & 0x1f);
        iVar36 = pSVar4->rgb_to_y[3] << (bVar5 & 0x1f);
        iVar23 = pSVar4->rgb_to_u[3] << (bVar5 & 0x1f);
      }
      uVar28 = width + 1U & 0x7ffffffe;
      uVar30 = (ulong)uVar28;
      uVar34 = height + 1U & 0x7ffffffe;
      uv_w_00 = width + 1U >> 1;
      uVar39 = (ulong)(uVar28 * 3);
      src = (fixed_y_t *)malloc(uVar39 * 4);
      sVar35 = uVar30 * uVar34 * 2;
      __ptr = (fixed_y_t *)malloc(sVar35);
      __ptr_00 = (fixed_y_t *)malloc(sVar35);
      dst = (fixed_y_t *)malloc(uVar30 * 4);
      uVar31 = (ulong)(uv_w_00 * 3);
      sVar35 = uVar34 * uVar31;
      __ptr_01 = (int16_t *)malloc(sVar35);
      __ptr_02 = (int16_t *)malloc(sVar35);
      sVar35 = uVar31 * 2;
      dst_00 = (fixed_t *)malloc(sVar35);
      auVar42._0_4_ = -(uint)((int)((ulong)__ptr >> 0x20) == 0 && (int)__ptr == 0);
      auVar42._4_4_ = -(uint)((int)__ptr_01 == 0 && (int)((ulong)__ptr_01 >> 0x20) == 0);
      auVar42._8_4_ = -(uint)((int)((ulong)__ptr_00 >> 0x20) == 0 && (int)__ptr_00 == 0);
      auVar42._12_4_ = -(uint)((int)__ptr_02 == 0 && (int)((ulong)__ptr_02 >> 0x20) == 0);
      iVar8 = movmskps((int)dst_00,auVar42);
      iVar29 = 0;
      if ((((iVar8 == 0) && (dst != (fixed_y_t *)0x0)) && (iVar29 = 0, dst_00 != (fixed_t *)0x0)) &&
         (src != (fixed_y_t *)0x0)) {
        iVar9 = rgb_bit_depth + iVar9;
        dVar40 = (double)uVar34 * (double)uVar28 * 3.0;
        local_a8 = (ulong)dVar40;
        local_a8 = (long)(dVar40 - 9.223372036854776e+18) & (long)local_a8 >> 0x3f | local_a8;
        pfVar19 = src + uVar39;
        lVar15 = (long)rgb_stride;
        uVar10 = (ulong)(uVar28 * 2);
        lVar33 = 0;
        lVar16 = 0;
        pfVar22 = __ptr;
        dst_01 = __ptr_00;
        for (iVar29 = 1; iVar29 + -1 < height; iVar29 = iVar29 + 2) {
          ImportOneRow((uint8_t *)((long)r_ptr + lVar33),(uint8_t *)((long)g_ptr + lVar33),
                       (uint8_t *)((long)b_ptr + lVar33),rgb_step,rgb_bit_depth,width,src);
          if (height == iVar29) {
            memcpy(pfVar19,src,uVar39 * 2);
          }
          else {
            ImportOneRow((uint8_t *)((long)r_ptr + lVar33 + lVar15),
                         (uint8_t *)((long)g_ptr + lVar33 + lVar15),
                         (uint8_t *)((long)b_ptr + lVar33 + lVar15),rgb_step,rgb_bit_depth,width,
                         pfVar19);
          }
          StoreGray(src,pfVar22,uVar28);
          StoreGray(pfVar19,(fixed_y_t *)((long)pfVar22 + uVar10),uVar28);
          UpdateW(src,dst_01,uVar28,rgb_bit_depth,transfer_type);
          UpdateW(pfVar19,(fixed_y_t *)((long)dst_01 + uVar10),uVar28,rgb_bit_depth,transfer_type);
          UpdateChroma(src,pfVar19,(fixed_t *)((long)__ptr_02 + lVar16),uv_w_00,rgb_bit_depth,
                       transfer_type);
          memcpy((void *)((long)__ptr_01 + lVar16),(fixed_t *)((long)__ptr_02 + lVar16),sVar35);
          dst_01 = dst_01 + (ulong)(uv_w_00 & 0x3fffffff) * 4;
          lVar16 = lVar16 + sVar35;
          pfVar22 = pfVar22 + (ulong)(uv_w_00 & 0x3fffffff) * 4;
          lVar33 = lVar33 + rgb_stride * 2;
        }
        local_48 = (long)(int)(uVar28 - 1);
        iVar29 = (int)(uVar28 - 1) >> 1;
        local_50 = (long)(int)(uVar28 * 2 + -1);
        local_80 = dst + uVar30;
        local_88 = (uVar10 - 2) + uVar39 * 2;
        local_90 = uVar10 - 2;
        local_58 = (ulong)(uv_w_00 * 2);
        local_98 = local_58 - 2;
        local_108 = 0xffffffffffffffff;
        uVar11 = 0;
        while ((int)uVar11 != 4) {
          uVar17 = 0;
          uVar38 = 0;
          piVar21 = __ptr_01;
          piVar20 = __ptr_01;
          puVar32 = __ptr;
          pfVar22 = __ptr_00;
          local_1e0 = __ptr_01;
          local_e0 = __ptr_02;
          local_a0 = uVar11;
          do {
            lVar15 = local_98;
            uVar11 = 0;
            if ((int)uVar17 < (int)(uVar34 - 2)) {
              uVar11 = uVar31;
            }
            local_38 = (long)local_1e0 + uVar11 * 2 + local_98;
            local_40 = (long)piVar20 + local_98;
            lVar18 = 0;
            lVar37 = 0;
            lVar16 = local_90;
            lVar33 = local_88;
            local_200 = uVar39 * 2;
            local_78 = piVar21;
            local_70 = pfVar22;
            local_68 = uVar17;
            local_60 = uVar38;
            for (iVar8 = -3; iVar8 != 0; iVar8 = iVar8 + 1) {
              piVar21 = (int16_t *)((long)(local_1e0 + uVar11) + lVar18);
              piVar1 = (int16_t *)((long)local_1e0 + lVar18);
              sVar3 = *piVar1;
              fVar7 = Filter2((int)sVar3,(int)*(int16_t *)((long)piVar20 + lVar18),(uint)*puVar32,
                              iVar9);
              *(fixed_y_t *)((long)src + lVar37) = fVar7;
              fVar7 = Filter2((int)sVar3,(int)*piVar21,(uint)puVar32[uVar30],iVar9);
              *(fixed_y_t *)((long)src + local_200) = fVar7;
              (*SharpYuvFilterRow)
                        (piVar1,(int16_t *)((long)piVar20 + lVar18),iVar29,puVar32 + 1,
                         (uint16_t *)((long)src + lVar37 + 2),iVar9);
              (*SharpYuvFilterRow)
                        (piVar1,piVar21,iVar29,puVar32 + uVar30 + 1,
                         (uint16_t *)((long)src + local_200 + 2),iVar9);
              A = (int)*(short *)((long)local_1e0 + lVar18 + lVar15);
              fVar7 = Filter2(A,(int)*(short *)(local_40 + lVar18),(uint)puVar32[local_48],iVar9);
              *(fixed_y_t *)((long)src + lVar16) = fVar7;
              fVar7 = Filter2(A,(int)*(short *)(local_38 + lVar18),(uint)puVar32[local_50],iVar9);
              *(fixed_y_t *)((long)src + lVar33) = fVar7;
              lVar33 = lVar33 + uVar10;
              local_200 = local_200 + uVar10;
              lVar16 = lVar16 + uVar10;
              lVar37 = lVar37 + uVar10;
              lVar18 = lVar18 + local_58;
            }
            UpdateW(src,dst,uVar28,rgb_bit_depth,transfer_type);
            UpdateW(pfVar19,local_80,uVar28,rgb_bit_depth,transfer_type);
            UpdateChroma(src,pfVar19,dst_00,uv_w_00,rgb_bit_depth,transfer_type);
            pfVar22 = local_70;
            uVar12 = (*SharpYuvUpdateY)(local_70,dst,puVar32,uVar28 * 2,iVar9);
            piVar21 = local_78;
            uVar38 = local_60 + uVar12;
            (*SharpYuvUpdateRGB)(local_e0,dst_00,local_78,uv_w_00 * 3);
            puVar32 = puVar32 + uVar10;
            piVar21 = piVar21 + uVar31;
            pfVar22 = pfVar22 + uVar10;
            local_e0 = local_e0 + uVar31;
            uVar13 = (int)local_68 + 2;
            uVar17 = (ulong)uVar13;
            piVar20 = local_1e0;
            local_1e0 = local_1e0 + uVar11;
          } while (uVar13 < uVar34);
          if (((int)local_a0 != 0) && ((uVar38 < local_a8 || (local_108 < uVar38)))) break;
          local_108 = uVar38;
          uVar11 = (ulong)((int)local_a0 + 1);
        }
        bVar6 = bVar5 + 0x10;
        iVar9 = 1 << (bVar5 + 0xf & 0x1f);
        uVar34 = 0;
        pfVar19 = __ptr;
        piVar21 = __ptr_01;
        do {
          uVar39 = 0;
          do {
            uVar13 = (uint)(uVar39 >> 1) & 0x7fffffff;
            uVar26 = pfVar19[uVar39];
            uVar13 = (int)(((int)*(short *)((long)piVar21 + (ulong)((uint)uVar39 & 0xfffffffe)) +
                           (uint)uVar26) * (int)local_d8 + iVar9 +
                           ((int)piVar21[uv_w_00 + uVar13] + (uint)uVar26) * local_d8._4_4_ +
                          ((int)piVar21[uVar13 + uVar28] + (uint)uVar26) * (int)uStack_d0 + iVar36)
                     >> (bVar6 & 0x1f);
            uVar26 = (ushort)uVar13;
            if (yuv_bit_depth < 9) {
              uVar14 = (uint)(byte)-(-1 < (short)uVar26);
              if (uVar26 < 0x100) {
                uVar14 = uVar13;
              }
              *(char *)((long)local_160 + uVar39) = (char)uVar14;
            }
            else {
              if ((int)uVar2 < (int)(short)uVar26) {
                uVar13 = uVar2;
              }
              uVar27 = (undefined2)uVar13;
              if ((short)uVar26 < 0) {
                uVar27 = 0;
              }
              *(undefined2 *)((long)local_160 + uVar39 * 2) = uVar27;
            }
            uVar39 = uVar39 + 1;
          } while (uVar39 < (uint)width);
          piVar21 = piVar21 + (uVar34 & 1) * uv_w_00 * 3;
          local_160 = (void *)((long)local_160 + (long)y_stride);
          uVar34 = uVar34 + 1;
          pfVar19 = (fixed_y_t *)((long)pfVar19 + uVar10);
        } while ((int)uVar34 < height);
        lVar15 = (ulong)(uv_w_00 << 2) + (long)__ptr_01;
        piVar21 = __ptr_01 + uv_w_00;
        uVar28 = 0;
        piVar20 = __ptr_01;
        do {
          uVar39 = 0;
          do {
            iVar36 = (int)*(short *)(lVar15 + uVar39 * 2);
            uVar34 = (int)local_c8 * piVar20[uVar39] + iVar9 +
                     (int)uStack_c0 * iVar36 + local_c8._4_4_ * piVar21[uVar39] + iVar23 >>
                     (bVar6 & 0x1f);
            uVar13 = piVar20[uVar39] * (int)local_b8 + iVar9 +
                     iVar36 * (int)uStack_b0 + piVar21[uVar39] * local_b8._4_4_ + iVar25 >>
                     (bVar6 & 0x1f);
            uVar24 = (ushort)uVar34;
            uVar26 = (ushort)uVar13;
            if (yuv_bit_depth < 9) {
              uVar14 = (uint)(byte)-(-1 < (short)uVar24);
              if (uVar24 < 0x100) {
                uVar14 = uVar34;
              }
              *(char *)((long)local_150 + uVar39) = (char)uVar14;
              uVar34 = (uint)(byte)-(-1 < (short)uVar26);
              if (uVar26 < 0x100) {
                uVar34 = uVar13;
              }
              *(char *)((long)local_158 + uVar39) = (char)uVar34;
            }
            else {
              if ((int)uVar2 < (int)(short)uVar24) {
                uVar34 = uVar2;
              }
              uVar27 = (undefined2)uVar34;
              if ((short)uVar24 < 0) {
                uVar27 = 0;
              }
              *(undefined2 *)((long)local_150 + uVar39 * 2) = uVar27;
              if ((int)uVar2 < (int)(short)uVar26) {
                uVar13 = uVar2;
              }
              uVar27 = (undefined2)uVar13;
              if ((short)uVar26 < 0) {
                uVar27 = 0;
              }
              *(undefined2 *)((long)local_158 + uVar39 * 2) = uVar27;
            }
            uVar39 = uVar39 + 1;
          } while (uVar39 < uv_w_00);
          local_150 = (void *)((long)local_150 + (long)u_stride);
          local_158 = (void *)((long)local_158 + (long)v_stride);
          uVar28 = uVar28 + 1;
          lVar15 = lVar15 + sVar35;
          piVar21 = piVar21 + uVar31;
          piVar20 = piVar20 + uVar31;
        } while (uVar28 < height + 1U >> 1);
        iVar29 = 1;
      }
      free(__ptr);
      free(__ptr_01);
      free(__ptr_00);
      free(__ptr_02);
      free(dst);
      free(dst_00);
      free(src);
    }
  }
  return iVar29;
}

Assistant:

int SharpYuvConvertWithOptions(const void* r_ptr, const void* g_ptr,
                               const void* b_ptr, int rgb_step, int rgb_stride,
                               int rgb_bit_depth, void* y_ptr, int y_stride,
                               void* u_ptr, int u_stride, void* v_ptr,
                               int v_stride, int yuv_bit_depth, int width,
                               int height, const SharpYuvOptions* options) {
  const SharpYuvConversionMatrix* yuv_matrix = options->yuv_matrix;
  SharpYuvTransferFunctionType transfer_type = options->transfer_type;
  SharpYuvConversionMatrix scaled_matrix;
  const int rgb_max = (1 << rgb_bit_depth) - 1;
  const int rgb_round = 1 << (rgb_bit_depth - 1);
  const int yuv_max = (1 << yuv_bit_depth) - 1;
  const int sfix = GetPrecisionShift(rgb_bit_depth);

  if (width < 1 || height < 1 || width == INT_MAX || height == INT_MAX ||
      r_ptr == NULL || g_ptr == NULL || b_ptr == NULL || y_ptr == NULL ||
      u_ptr == NULL || v_ptr == NULL) {
    return 0;
  }
  if (rgb_bit_depth != 8 && rgb_bit_depth != 10 && rgb_bit_depth != 12 &&
      rgb_bit_depth != 16) {
    return 0;
  }
  if (yuv_bit_depth != 8 && yuv_bit_depth != 10 && yuv_bit_depth != 12) {
    return 0;
  }
  if (rgb_bit_depth > 8 && (rgb_step % 2 != 0 || rgb_stride % 2 != 0)) {
    // Step/stride should be even for uint16_t buffers.
    return 0;
  }
  if (yuv_bit_depth > 8 &&
      (y_stride % 2 != 0 || u_stride % 2 != 0 || v_stride % 2 != 0)) {
    // Stride should be even for uint16_t buffers.
    return 0;
  }
  // The address of the function pointer is used to avoid a read race.
  SharpYuvInit((VP8CPUInfo)&SharpYuvGetCPUInfo);

  // Add scaling factor to go from rgb_bit_depth to yuv_bit_depth, to the
  // rgb->yuv conversion matrix.
  if (rgb_bit_depth == yuv_bit_depth) {
    memcpy(&scaled_matrix, yuv_matrix, sizeof(scaled_matrix));
  } else {
    int i;
    for (i = 0; i < 3; ++i) {
      scaled_matrix.rgb_to_y[i] =
          (yuv_matrix->rgb_to_y[i] * yuv_max + rgb_round) / rgb_max;
      scaled_matrix.rgb_to_u[i] =
          (yuv_matrix->rgb_to_u[i] * yuv_max + rgb_round) / rgb_max;
      scaled_matrix.rgb_to_v[i] =
          (yuv_matrix->rgb_to_v[i] * yuv_max + rgb_round) / rgb_max;
    }
  }
  // Also incorporate precision change scaling.
  scaled_matrix.rgb_to_y[3] = Shift(yuv_matrix->rgb_to_y[3], sfix);
  scaled_matrix.rgb_to_u[3] = Shift(yuv_matrix->rgb_to_u[3], sfix);
  scaled_matrix.rgb_to_v[3] = Shift(yuv_matrix->rgb_to_v[3], sfix);

  return DoSharpArgbToYuv(
      (const uint8_t*)r_ptr, (const uint8_t*)g_ptr, (const uint8_t*)b_ptr,
      rgb_step, rgb_stride, rgb_bit_depth, (uint8_t*)y_ptr, y_stride,
      (uint8_t*)u_ptr, u_stride, (uint8_t*)v_ptr, v_stride, yuv_bit_depth,
      width, height, &scaled_matrix, transfer_type);
}